

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O0

size_t pstore::utf::length(czstring str)

{
  size_t sVar1;
  size_t local_18;
  czstring str_local;
  
  if (str == (czstring)0x0) {
    local_18 = 0;
  }
  else {
    sVar1 = strlen(str);
    local_18 = length<char_const*>(str,str + sVar1);
  }
  return local_18;
}

Assistant:

auto length (gsl::czstring const str) -> std::size_t {
            return str == nullptr ? 0 : length (str, str + std::strlen (str));
        }